

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getline.c
# Opt level: O2

nh_bool curses_get_ext_cmd(char *cmd_out,char **namelist,char **desclist,wchar_t listlen)

{
  nh_menuitem_conflict *pnVar1;
  int iVar2;
  int iVar3;
  wchar_t wVar4;
  void *__ptr;
  size_t __n;
  size_t sVar5;
  wchar_t *results;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  bool bVar10;
  char cVar11;
  wchar_t icount;
  long lVar12;
  ulong uVar13;
  wchar_t local_2c0;
  nh_menuitem_conflict *local_2b8;
  long local_2b0;
  int local_294;
  extcmd_hook_args hpa;
  char local_258 [32];
  char prompt [128];
  char cbuf [128];
  char buf [256];
  
  hpa.namelist = namelist;
  hpa.desclist = desclist;
  hpa.listlen = listlen;
  if (settings.extmenu == '\0') {
    hooked_curses_getlin("extended command: (? for help)",cmd_out,ext_cmd_getlin_hook,&hpa);
    pcVar6 = cmd_out;
    bVar10 = true;
    for (pcVar7 = cmd_out; cVar11 = *pcVar7, cVar11 != '\0'; pcVar7 = pcVar7 + 1) {
      if (cVar11 == '\t') {
        cVar11 = ' ';
      }
      if ((bVar10 & cVar11 == ' ') == 0) {
        *pcVar6 = cVar11;
        pcVar6 = pcVar6 + 1;
      }
      bVar10 = cVar11 == ' ';
    }
    pcVar6[-(ulong)(byte)(bVar10 & cmd_out < pcVar6)] = '\0';
    return *cmd_out != '\x1b' && *cmd_out != '\0';
  }
  local_2b8 = (nh_menuitem_conflict *)malloc(0xa78);
  __ptr = malloc((long)listlen * 4 + 4);
  cbuf[0] = '\0';
  if (listlen < L'\x01') {
    listlen = L'\0';
  }
  uVar13 = (ulong)(uint)listlen;
  local_2c0 = L'\n';
  iVar9 = 0;
  local_294 = 0;
  local_2b0 = 0;
  while (iVar9 == 0) {
    __n = (size_t)(int)local_2b0;
    iVar9 = 0;
    for (uVar8 = 0; lVar12 = (long)iVar9, uVar13 != uVar8; uVar8 = uVar8 + 1) {
      if (((int)local_2b0 == 0) || (iVar2 = strncmp(namelist[uVar8],cbuf,__n), iVar2 == 0)) {
        iVar9 = iVar9 + 1;
        *(int *)((long)__ptr + lVar12 * 4) = (int)uVar8;
        sVar5 = strlen(desclist[uVar8]);
        if ((ulong)(long)local_294 < sVar5) {
          local_294 = (int)sVar5;
          sprintf(local_258,"%%-%ds",(ulong)(local_294 + 0xf));
        }
      }
    }
    *(undefined4 *)((long)__ptr + lVar12 * 4) = 0xffffffff;
    if (iVar9 == 1) {
      uVar8 = 0;
      goto LAB_00109ead;
    }
    uVar8 = 0;
    iVar2 = 0;
    icount = L'\0';
    wVar4 = L'\0';
    while( true ) {
      if (uVar13 == uVar8) break;
      iVar3 = *(int *)((long)__ptr + uVar8 * 4);
      if ((long)iVar3 < 0) break;
      pcVar6 = namelist[iVar3];
      cVar11 = pcVar6[__n];
      if (iVar2 == 0 || wVar4 == cVar11 && 0x11 < iVar9) {
        if (iVar2 == 0 || iVar9 < 0x12) goto LAB_00109c32;
        if (iVar2 == 1) {
          sprintf(prompt,"%s or %s",namelist[*(int *)((long)__ptr + uVar8 * 4 + -4)],pcVar6);
          iVar2 = 1;
        }
        else {
          sVar5 = strlen(prompt);
          builtin_strncpy(prompt + sVar5," or ",5);
          strcat(prompt,pcVar6);
        }
      }
      else {
        sprintf(buf,local_258,prompt);
        if (local_2c0 <= icount) {
          local_2c0 = local_2c0 * 2;
          local_2b8 = (nh_menuitem_conflict *)realloc(local_2b8,(long)local_2c0 * 0x10c);
        }
        pnVar1 = local_2b8 + icount;
        pnVar1->id = wVar4;
        pnVar1->role = MI_NORMAL;
        pnVar1->accel = (char)wVar4;
        pnVar1->group_accel = '\0';
        pnVar1->selected = '\0';
        strcpy(pnVar1->caption,buf);
        icount = icount + L'\x01';
        iVar3 = *(int *)((long)__ptr + uVar8 * 4);
        iVar2 = 0;
LAB_00109c32:
        sprintf(prompt,"%s [%s]",namelist[iVar3],desclist[iVar3]);
      }
      iVar2 = iVar2 + 1;
      uVar8 = uVar8 + 1;
      wVar4 = (int)cVar11;
    }
    if (iVar2 != 0) {
      sprintf(buf,local_258,prompt);
      if (local_2c0 <= icount) {
        local_2c0 = local_2c0 * 2;
        local_2b8 = (nh_menuitem_conflict *)realloc(local_2b8,(long)local_2c0 * 0x10c);
      }
      pnVar1 = local_2b8 + icount;
      pnVar1->id = wVar4;
      pnVar1->role = MI_NORMAL;
      pnVar1->accel = (char)wVar4;
      pnVar1->group_accel = '\0';
      pnVar1->selected = '\0';
      strcpy(pnVar1->caption,buf);
      icount = icount + L'\x01';
    }
    results = (wchar_t *)malloc((long)icount * 4);
    sprintf(prompt,"Extended Command: %s",cbuf);
    wVar4 = curses_display_menu(local_2b8,icount,prompt,L'\x01',results);
    if (wVar4 == L'\x01') {
      iVar9 = -1;
      if ((int)local_2b0 < 0x7f) {
        local_2b0 = __n + 1;
        cbuf[__n] = (char)*results;
        cbuf[__n + 1] = '\0';
        iVar9 = 0;
      }
    }
    else {
      iVar9 = -(uint)((int)local_2b0 == 0);
      local_2b0 = 0;
    }
    free(results);
  }
  uVar8 = 0xffffffffffffffff;
LAB_00109ed5:
  free(__ptr);
  free(local_2b8);
  iVar9 = (int)uVar8;
  if (iVar9 != -1) {
    strcpy(cmd_out,namelist[iVar9]);
  }
  return iVar9 != -1;
LAB_00109ead:
  if (uVar13 == uVar8) goto LAB_00109ed1;
  iVar9 = strncmp(namelist[uVar8],cbuf,__n);
  if (iVar9 == 0) goto LAB_00109ed5;
  uVar8 = uVar8 + 1;
  goto LAB_00109ead;
LAB_00109ed1:
  uVar8 = 0;
  goto LAB_00109ed5;
}

Assistant:

nh_bool curses_get_ext_cmd(char *cmd_out, const char **namelist,
			   const char **desclist, int listlen)
{
	int i;
	struct extcmd_hook_args hpa = {namelist, desclist, listlen};

	if (settings.extmenu) {
	    i = extcmd_via_menu(namelist, desclist, listlen);
	    if (i == -1)
		return FALSE;
	    strcpy(cmd_out, namelist[i]);
	    return TRUE;
	}

	/* maybe a runtime option? */
	hooked_curses_getlin("extended command: (? for help)", cmd_out,
			     ext_cmd_getlin_hook, &hpa);
	mungspaces(cmd_out);
	if (cmd_out[0] == 0 || cmd_out[0] == '\033')
	    return FALSE;
	
	return TRUE;
}